

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

vector<Item,_std::allocator<Item>_> * __thiscall
Instance::sorted_items(vector<Item,_std::allocator<Item>_> *__return_storage_ptr__,Instance *this)

{
  __normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_> __seed;
  Item *pIVar1;
  long lVar2;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>,_Item>
  local_30;
  
  std::vector<Item,_std::allocator<Item>_>::vector(__return_storage_ptr__,&this->items);
  __seed._M_current =
       (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pIVar1 = (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__seed._M_current != pIVar1) {
    lVar2 = ((long)pIVar1 - (long)__seed._M_current >> 3) * -0x71c71c71c71c71c7;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>,_Item>
    ::_Temporary_buffer(&local_30,__seed,(lVar2 - (lVar2 + 1 >> 0x3f)) + 1 >> 1);
    if (local_30._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<Item*,std::vector<Item,std::allocator<Item>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (__seed._M_current,pIVar1);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<Item*,std::vector<Item,std::allocator<Item>>>,Item*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (__seed._M_current,pIVar1,local_30._M_buffer,local_30._M_len);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>,_Item>
    ::~_Temporary_buffer(&local_30);
  }
  std::__reverse<__gnu_cxx::__normal_iterator<Item*,std::vector<Item,std::allocator<Item>>>>
            ((__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Item> Instance::sorted_items() {
	std::vector<Item> sitems(items);
	std::stable_sort(all(sitems));
	std::reverse(all(sitems));
	return sitems;
}